

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acceln.cpp
# Opt level: O3

void embree::AccelN::occluded16
               (void *valid,Intersectors *This_in,RTCRay16 *ray,RayQueryContext *context)

{
  AccelData *pAVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined4 uVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  pAVar1 = This_in->ptr;
  lVar7 = *(long *)&pAVar1[3].type;
  lVar8 = *(long *)&pAVar1[3].field_0x58;
  if (lVar8 != lVar7) {
    uVar9 = 0;
    do {
      lVar2 = *(long *)(lVar7 + uVar9 * 8);
      if (*(float *)(lVar2 + 0x10) < INFINITY) {
        uVar5 = (**(code **)(lVar2 + 0x130))(valid,lVar2 + 0x58,ray,context);
        auVar10._0_4_ = -(uint)(0.0 <= ray->tfar[4]) & *(uint *)((long)valid + 0x10);
        auVar10._4_4_ = -(uint)(0.0 <= ray->tfar[5]) & *(uint *)((long)valid + 0x14);
        auVar10._8_4_ = -(uint)(0.0 <= ray->tfar[6]) & *(uint *)((long)valid + 0x18);
        auVar10._12_4_ = -(uint)(0.0 <= ray->tfar[7]) & *(uint *)((long)valid + 0x1c);
        auVar3._4_4_ = -(uint)(0.0 <= ray->tfar[1]) & *(uint *)((long)valid + 4);
        auVar3._0_4_ = -(uint)(0.0 <= ray->tfar[0]) & *valid;
        auVar3._8_4_ = -(uint)(0.0 <= ray->tfar[2]) & *(uint *)((long)valid + 8);
        auVar3._12_4_ = -(uint)(0.0 <= ray->tfar[3]) & *(uint *)((long)valid + 0xc);
        auVar11._0_4_ = -(uint)(0.0 <= ray->tfar[0xc]) & *(uint *)((long)valid + 0x30);
        auVar11._4_4_ = -(uint)(0.0 <= ray->tfar[0xd]) & *(uint *)((long)valid + 0x34);
        auVar11._8_4_ = -(uint)(0.0 <= ray->tfar[0xe]) & *(uint *)((long)valid + 0x38);
        auVar11._12_4_ = -(uint)(0.0 <= ray->tfar[0xf]) & *(uint *)((long)valid + 0x3c);
        auVar4._4_4_ = -(uint)(0.0 <= ray->tfar[9]) & *(uint *)((long)valid + 0x24);
        auVar4._0_4_ = -(uint)(0.0 <= ray->tfar[8]) & *(uint *)((long)valid + 0x20);
        auVar4._8_4_ = -(uint)(0.0 <= ray->tfar[10]) & *(uint *)((long)valid + 0x28);
        auVar4._12_4_ = -(uint)(0.0 <= ray->tfar[0xb]) & *(uint *)((long)valid + 0x2c);
        iVar6 = movmskps(uVar5,auVar11 | auVar4 | auVar10 | auVar3);
        if (iVar6 == 0) {
          return;
        }
        lVar7 = *(long *)&pAVar1[3].type;
        lVar8 = *(long *)&pAVar1[3].field_0x58;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < (ulong)(lVar8 - lVar7 >> 3));
  }
  return;
}

Assistant:

void AccelN::occluded16 (const void* valid, Accel::Intersectors* This_in, RTCRay16& ray, RayQueryContext* context) 
  {
    AccelN* This = (AccelN*)This_in->ptr;
    for (size_t i=0; i<This->accels.size(); i++) {
      if (This->accels[i]->isEmpty()) continue;
      This->accels[i]->intersectors.occluded16(valid,ray,context);
#if defined(__SSE2__) || defined(__ARM_NEON) // FIXME: use higher ISA
      vbool4 valid0 = asBool(((vint4*)valid)[0]);
      vbool4 hit0   = ((vfloat4*)ray.tfar)[0] >= vfloat4(zero);
      vbool4 valid1 = asBool(((vint4*)valid)[1]);
      vbool4 hit1   = ((vfloat4*)ray.tfar)[1] >= vfloat4(zero);
      vbool4 valid2 = asBool(((vint4*)valid)[2]);
      vbool4 hit2   = ((vfloat4*)ray.tfar)[2] >= vfloat4(zero);
      vbool4 valid3 = asBool(((vint4*)valid)[3]);
      vbool4 hit3   = ((vfloat4*)ray.tfar)[3] >= vfloat4(zero);
      if (unlikely((none((valid0 & hit0) | (valid1 & hit1) | (valid2 & hit2) | (valid3 & hit3))))) break;
#endif
    }
  }